

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::CLOSURE_OP(SQVM *this,SQObjectPtr *target,SQFunctionProto *func,SQInteger boundtarget)

{
  SQObjectType type;
  long lVar1;
  SQClosure *pSVar2;
  SQWeakRef *pSVar3;
  SQChar *pSVar4;
  SQObjectPtr *in_RCX;
  SQVM *in_RDX;
  SQVM *in_RDI;
  SQObjectType t;
  SQObjectPtr *val;
  SQInteger spos;
  SQInteger i_1;
  SQInteger ndefparams;
  SQOuterVar *v;
  SQInteger i;
  SQClosure *closure;
  SQInteger nouters;
  SQObjectType in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  SQSharedState *root;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  long local_58;
  long local_40;
  SQTable *stackindex;
  SQVM *this_00;
  
  root = in_RDI->_sharedstate;
  this_00 = in_RDX;
  SQRefCounted::GetWeakRef
            ((SQRefCounted *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  pSVar2 = SQClosure::Create((SQSharedState *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             (SQFunctionProto *)in_RDX,(SQWeakRef *)root);
  stackindex = (this_00->temp_reg).super_SQObject._unVal.pTable;
  if (stackindex != (SQTable *)0x0) {
    for (local_40 = 0; local_40 < (long)stackindex; local_40 = local_40 + 1) {
      in_stack_ffffffffffffff74 = *(int *)(&this_00->_callsstack->_ip + local_40 * 5);
      if (in_stack_ffffffffffffff74 == 0) {
        FindOuter(this_00,in_RCX,(SQObjectPtr *)stackindex);
      }
      else if (in_stack_ffffffffffffff74 == 1) {
        ::SQObjectPtr::operator=((SQObjectPtr *)root,(SQObjectPtr *)in_RDI);
      }
    }
  }
  lVar1 = this_00->_callsstacksize;
  if (lVar1 != 0) {
    for (local_58 = 0; local_58 < lVar1; local_58 = local_58 + 1) {
      ::SQObjectPtr::operator=((SQObjectPtr *)root,(SQObjectPtr *)in_RDI);
    }
  }
  if (in_RCX != (SQObjectPtr *)0xff) {
    type = (in_RDI->_stack)._vals[(long)&(in_RCX->super_SQObject)._type + in_RDI->_stackbase].
           super_SQObject._type;
    if ((((type != OT_TABLE) && (type != OT_CLASS)) && (type != OT_INSTANCE)) && (type != OT_ARRAY))
    {
      pSVar4 = IdType2Name(type);
      Raise_Error(in_RDI,"cannot bind a %s as environment object",pSVar4);
      (*(pSVar2->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
      return false;
    }
    pSVar3 = SQRefCounted::GetWeakRef
                       ((SQRefCounted *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c);
    pSVar2->_env = pSVar3;
    (pSVar2->_env->super_SQRefCounted)._uiRef = (pSVar2->_env->super_SQRefCounted)._uiRef + 1;
  }
  ::SQObjectPtr::operator=((SQObjectPtr *)root,(SQClosure *)in_RDI);
  return true;
}

Assistant:

bool SQVM::CLOSURE_OP(SQObjectPtr &target, SQFunctionProto *func,SQInteger boundtarget)
{
    SQInteger nouters;
    SQClosure *closure = SQClosure::Create(_ss(this), func,_table(_roottable)->GetWeakRef(OT_TABLE));
    if((nouters = func->_noutervalues)) {
        for(SQInteger i = 0; i<nouters; i++) {
            SQOuterVar &v = func->_outervalues[i];
            switch(v._type){
            case otLOCAL:
                FindOuter(closure->_outervalues[i], &STK(_integer(v._src)));
                break;
            case otOUTER:
                closure->_outervalues[i] = _closure(ci->_closure)->_outervalues[_integer(v._src)];
                break;
            }
        }
    }
    SQInteger ndefparams;
    if((ndefparams = func->_ndefaultparams)) {
        for(SQInteger i = 0; i < ndefparams; i++) {
            SQInteger spos = func->_defaultparams[i];
            closure->_defaultparams[i] = _stack._vals[_stackbase + spos];
        }
    }
	if (boundtarget != 0xFF) {
		SQObjectPtr &val = _stack._vals[_stackbase + boundtarget];
		SQObjectType t = sq_type(val);
		if (t == OT_TABLE || t == OT_CLASS || t == OT_INSTANCE || t == OT_ARRAY) {
			closure->_env = _refcounted(val)->GetWeakRef(t);
			__ObjAddRef(closure->_env);
		}
		else {
			Raise_Error(_SC("cannot bind a %s as environment object"), IdType2Name(t));
			closure->Release();
			return false;
		}
	}
    target = closure;
    return true;

}